

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

int ll_insert_tail(ll_head *q_head,ll_elem *n,int wait)

{
  atomic_size_t *paVar1;
  int iVar2;
  ll_elem *plVar3;
  size_t count;
  size_t count_00;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x487,
                  "int ll_insert_tail(struct ll_head *, struct ll_elem *, int)");
  }
  if ((ll_elem *)((ulong)n & 0xfffffffffffffffc) == n) {
    if (wait == 0) {
      iVar2 = insert_lock(n);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      unlink_release((ll_head *)n,(ll_elem *)0x1,wait);
    }
    LOCK();
    paVar1 = &((ll_elem *)((ulong)n & 0xfffffffffffffffc))->refcnt;
    *paVar1 = *paVar1 + 1;
    UNLOCK();
    do {
      plVar3 = pred(q_head,&q_head->q);
      iVar2 = insert_between(q_head,n,(ll_elem *)((ulong)plVar3 & 0xfffffffffffffffc),&q_head->q);
      deref_release((ll_head *)((ulong)plVar3 & 0xfffffffffffffffc),(ll_elem *)0x1,count);
    } while (iVar2 == 0);
    deref_release((ll_head *)n,(ll_elem *)0x1,count_00);
    return 1;
  }
  __assert_fail("n == ptr_clear(n)",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x488,
                "int ll_insert_tail(struct ll_head *, struct ll_elem *, int)");
}

Assistant:

int
ll_insert_tail(struct ll_head *q_head, struct ll_elem *n, int wait)
{
	struct ll_elem	*q, *p;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));

	/*
	 * Mark n for insert.  If this fails, n is either on a queue or
	 * being inserted/deleted.
	 *
	 * Required that n is properly initialized.
	 */
	if (wait)
		unlink_release(q_head, n, 1);
	else if (!insert_lock(n))
		return 0;
	deref_acquire(n, 1);

	p = ptr_clear(pred(q_head, q));

	/*
	 * We now have:
	 * - p -- the predecessor of the insert position
	 * - q -- the successor of the insert position
	 * - n -- the node we need to insert between p and q
	 *
	 * Note that p may be deleted by the time we read this
	 * comment.
	 */
	while (!insert_between(q_head, n, p, q)) {
		/*
		 * Insert failed.
		 * This means p is no longer suitable.
		 */

		/* Re-resolve s. */
		deref_release(q_head, p, 1);
		p = ptr_clear(pred(q_head, q));
	}

	/*
	 * We have succesfully inserted n.  Release our reference on n and p.
	 */
	deref_release(q_head, p, 1);
	deref_release(q_head, n, 1);
	return 1;
}